

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  LYS_NODE LVar1;
  int mask_local;
  lys_node *node_local;
  int level_local;
  lyout *out_local;
  
  LVar1 = node->nodetype & mask;
  if (LVar1 == LYS_CONTAINER) {
    yin_print_container(out,level,node);
    return;
  }
  if (LVar1 == LYS_CHOICE) {
    yin_print_choice(out,level,node);
    return;
  }
  if (LVar1 == LYS_LEAF) {
    yin_print_leaf(out,level,node);
    return;
  }
  if (LVar1 == LYS_LEAFLIST) {
    yin_print_leaflist(out,level,node);
    return;
  }
  if (LVar1 == LYS_LIST) {
    yin_print_list(out,level,node);
    return;
  }
  if (LVar1 == LYS_ANYXML) {
LAB_001d1d14:
    yin_print_anydata(out,level,node);
  }
  else {
    if (LVar1 == LYS_CASE) {
      yin_print_case(out,level,node);
      return;
    }
    if (LVar1 == LYS_NOTIF) {
      yin_print_notif(out,level,node);
      return;
    }
    if (LVar1 != LYS_RPC) {
      if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        yin_print_input_output(out,level,node);
        return;
      }
      if (LVar1 == LYS_GROUPING) {
        yin_print_grouping(out,level,node);
        return;
      }
      if (LVar1 == LYS_USES) {
        yin_print_uses(out,level,node);
        return;
      }
      if (LVar1 != LYS_ACTION) {
        if (LVar1 != LYS_ANYDATA) {
          return;
        }
        goto LAB_001d1d14;
      }
    }
    yin_print_rpc_action(out,level,node);
  }
  return;
}

Assistant:

static void
yin_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yin_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yin_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yin_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yin_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yin_print_list(out, level, node);
        break;
    case LYS_USES:
        yin_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yin_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yin_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yin_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yin_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yin_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yin_print_notif(out, level, node);
        break;
    default:
        break;
    }
}